

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

Circle * __thiscall svg::Circle::toString_abi_cxx11_(Circle *this,Layout *layout)

{
  ostream *poVar1;
  Layout *in_RDX;
  string local_3c8 [32];
  undefined1 local_3a8 [32];
  Fill local_388;
  allocator local_361;
  string local_360 [32];
  double local_340;
  allocator local_331;
  string local_330 [32];
  svg local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  double local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  svg local_298 [39];
  allocator local_271;
  string local_270 [32];
  double local_250;
  allocator local_241;
  string local_240 [32];
  svg local_220 [55];
  allocator local_1e9;
  string local_1e8 [32];
  svg local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Layout *local_20;
  Layout *layout_local;
  Circle *this_local;
  
  local_20 = in_RDX;
  layout_local = layout;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"circle",&local_1e9);
  elemStart(local_1c8,(string *)local_1e8);
  poVar1 = std::operator<<(local_198,(string *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"cx",&local_241);
  local_250 = translateX(layout[1].origin_offset.x,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"",&local_271);
  attribute<double>(local_220,(string *)local_240,&local_250,(string *)local_270);
  poVar1 = std::operator<<(poVar1,(string *)local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"cy",&local_2b9);
  local_2c8 = translateY(layout[1].origin_offset.y,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"",&local_2e9);
  attribute<double>(local_298,(string *)local_2b8,&local_2c8,(string *)local_2e8);
  poVar1 = std::operator<<(poVar1,(string *)local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"r",&local_331);
  local_340 = translateScale(layout[2].dimensions.width,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"",&local_361);
  attribute<double>(local_310,(string *)local_330,&local_340,(string *)local_360);
  poVar1 = std::operator<<(poVar1,(string *)local_310);
  Fill::toString_abi_cxx11_((Fill *)(local_3a8 + 0x20),(Layout *)&(layout->dimensions).height);
  poVar1 = std::operator<<(poVar1,(string *)(local_3a8 + 0x20));
  Stroke::toString_abi_cxx11_((Stroke *)local_3a8,(Layout *)&(layout->origin_offset).y);
  poVar1 = std::operator<<(poVar1,(string *)local_3a8);
  emptyElemEnd_abi_cxx11_();
  std::operator<<(poVar1,local_3c8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("circle") << attribute("cx", translateX(center.x, layout))
                << attribute("cy", translateY(center.y, layout))
                << attribute("r", translateScale(radius, layout)) << fill.toString(layout)
                << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }